

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O1

void __thiscall MidiOutAlsa::openVirtualPort(MidiOutAlsa *this,string *portName)

{
  undefined8 *puVar1;
  pointer pcVar2;
  int iVar3;
  string local_38;
  
  puVar1 = (undefined8 *)(this->super_MidiOutApi).super_MidiApi.apiData_;
  if (*(int *)((long)puVar1 + 0xc) < 0) {
    iVar3 = snd_seq_create_simple_port(*puVar1,(portName->_M_dataplus)._M_p,0x21,0x100002);
    *(int *)((long)puVar1 + 0xc) = iVar3;
    if (iVar3 < 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&(this->super_MidiOutApi).super_MidiApi.errorString_,0,
                 (char *)(this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length,
                 0x10d73a);
      pcVar2 = (this->super_MidiOutApi).super_MidiApi.errorString_._M_dataplus._M_p;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,pcVar2,
                 pcVar2 + (this->super_MidiOutApi).super_MidiApi.errorString_._M_string_length);
      MidiApi::error((MidiApi *)this,DRIVER_ERROR,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void MidiOutAlsa :: openVirtualPort( const std::string &portName )
{
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( data->vport < 0 ) {
    data->vport = snd_seq_create_simple_port( data->seq, portName.c_str(),
                                              SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ,
                                              SND_SEQ_PORT_TYPE_MIDI_GENERIC|SND_SEQ_PORT_TYPE_APPLICATION );

    if ( data->vport < 0 ) {
      errorString_ = "MidiOutAlsa::openVirtualPort: ALSA error creating virtual port.";
      error( RtMidiError::DRIVER_ERROR, errorString_ );
    }
  }
}